

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O3

bool __thiscall libtorrent::aux::torrent::is_finished(torrent *this)

{
  _Head_base<0UL,_libtorrent::aux::piece_picker_*,_false> _Var1;
  bool bVar2;
  bool bVar3;
  
  bVar2 = is_seed(this);
  bVar3 = true;
  if (!bVar2) {
    if (((((this->super_torrent_hot_members).m_torrent_file.
           super___shared_ptr<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m_files
         ).m_piece_length < 1) ||
       (_Var1._M_head_impl =
             (this->super_torrent_hot_members).m_picker._M_t.
             super___uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
             ._M_t.
             super__Tuple_impl<0UL,_libtorrent::aux::piece_picker_*,_std::default_delete<libtorrent::aux::piece_picker>_>
             .super__Head_base<0UL,_libtorrent::aux::piece_picker_*,_false>._M_head_impl,
       _Var1._M_head_impl == (piece_picker *)0x0)) {
      bVar3 = false;
    }
    else {
      bVar3 = (int)((ulong)((long)*(pointer *)((long)&(_Var1._M_head_impl)->m_piece_map + 8) -
                           *(long *)&(_Var1._M_head_impl)->m_piece_map) >> 3) -
              (_Var1._M_head_impl)->m_num_filtered <= (_Var1._M_head_impl)->m_num_passed;
    }
  }
  return bVar3;
}

Assistant:

bool torrent::is_finished() const
	{
		if (is_seed()) return true;
		return valid_metadata() && has_picker() && m_picker->is_finished();
	}